

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ClassExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ClassExpr *this)

{
  Token *pTVar1;
  bool bVar2;
  type caps;
  Lexer *pLVar3;
  reference this_00;
  pointer pBVar4;
  pointer this_01;
  string local_138;
  reference local_118;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *function;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *__range1_1;
  reference local_d8;
  unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *biopexpr;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *__range1;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  const_iterator it;
  string local_60;
  string local_40;
  undefined1 local_19;
  ClassExpr *local_18;
  ClassExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ClassExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->super_Capable);
  if (bVar2) {
    caps = std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
           operator*(&(this->super_Capable).caps);
    _capsToString_abi_cxx11_(&local_40,caps);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"class");
  bVar2 = std::
          vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
          ::empty(&this->templs);
  if (!bVar2) {
    _templateToString_abi_cxx11_(&local_60,&this->templs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
  pTVar1 = this->tokId;
  pLVar3 = Expr::getLexer(&this->super_Expr);
  (*pTVar1->_vptr_Token[2])((string *)&it,pTVar1,pLVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&it);
  std::__cxx11::string::~string((string *)&it);
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       ::begin(&this->constructAttributes);
  while( true ) {
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
         ::end(&this->constructAttributes);
    bVar2 = std::operator!=(&local_88,&local_90);
    if (!bVar2) break;
    local_98._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
         ::begin(&this->constructAttributes);
    bVar2 = std::operator==(&local_88,&local_98);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    this_00 = std::
              _List_const_iterator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>
              ::operator*(&local_88);
    pBVar4 = std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::operator->
                       (this_00);
    BiOpExpr::toString_abi_cxx11_((string *)&__range1,pBVar4);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1);
    std::__cxx11::string::~string((string *)&__range1);
    std::
    _List_const_iterator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>
    ::operator++(&local_88);
  }
  bVar2 = std::__cxx11::
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          ::empty(&this->constructAttributes);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  __end1 = std::__cxx11::
           list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
           ::begin(&this->attributes);
  biopexpr = (unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
             std::__cxx11::
             list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
             ::end(&this->attributes);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&biopexpr), bVar2) {
    local_d8 = std::
               _List_const_iterator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>
               ::operator*(&__end1);
    pBVar4 = std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::operator->
                       (local_d8);
    BiOpExpr::toString_abi_cxx11_((string *)&__range1_1,pBVar4);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    std::
    _List_const_iterator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::
             list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
             ::begin(&this->functions);
  function = (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
             std::__cxx11::
             list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
             ::end(&this->functions);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&function), bVar2) {
    local_118 = std::
                _List_const_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
                ::operator*(&__end1_1);
    this_01 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
              operator->(local_118);
    FuncExpr::toString_abi_cxx11_(&local_138,this_01);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    std::
    _List_const_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
    ::operator++(&__end1_1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string ClassExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);

  result += "class";
  if (!templs.empty()) {
    result += _templateToString(templs);
  }

  result += ' ';
  result += tokId->toString(getLexer());
  for (auto it = constructAttributes.begin();
      it != constructAttributes.end(); ++it) {
    if (it == constructAttributes.begin())
      result += '(';
    else
      result += ", ";

    result += (*it)->toString();
  }

  if (!constructAttributes.empty())
    result += ')';

  result += '\n';

  for (const auto &biopexpr : attributes) {
    result += biopexpr->toString();
    result += '\n';
  }

  for (const auto &function : functions) {
    result += function->toString();
    result += '\n';
  }

  result += ';';

  return result;
}